

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

cbtMultiSphereShape * __thiscall
cbtCollisionWorldImporter::createMultiSphereShape
          (cbtCollisionWorldImporter *this,cbtVector3 *positions,cbtScalar *radi,int numSpheres)

{
  cbtMultiSphereShape *this_00;
  cbtMultiSphereShape *local_30;
  
  this_00 = (cbtMultiSphereShape *)cbtMultiSphereShape::operator_new(0xa8);
  cbtMultiSphereShape::cbtMultiSphereShape(this_00,positions,radi,numSpheres);
  local_30 = this_00;
  cbtAlignedObjectArray<cbtCollisionShape_*>::push_back
            (&this->m_allocatedCollisionShapes,(cbtCollisionShape **)&local_30);
  return this_00;
}

Assistant:

cbtMultiSphereShape* cbtCollisionWorldImporter::createMultiSphereShape(const cbtVector3* positions, const cbtScalar* radi, int numSpheres)
{
	cbtMultiSphereShape* shape = new cbtMultiSphereShape(positions, radi, numSpheres);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}